

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

HttpResponse * __thiscall
HttpClient::RunRequest
          (HttpResponse *__return_storage_ptr__,HttpClient *this,string *url,string *type)

{
  bool bVar1;
  URL *pUVar2;
  allocator local_441;
  string local_440 [32];
  Log local_420;
  string local_3f8 [38];
  undefined1 local_3d2;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  undefined1 local_390 [64];
  TCPClient local_350 [39];
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  undefined1 local_2e8 [64];
  TCPClient local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string local_260 [32];
  undefined1 local_240 [96];
  string local_1e0 [32];
  undefined1 local_1c0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  string local_a0 [8];
  string result;
  string local_80 [8];
  string message;
  string local_5e;
  undefined1 local_5d;
  TCPClient client;
  string local_50 [32];
  URL *local_30;
  URL *urlObject;
  string *type_local;
  string *url_local;
  HttpClient *this_local;
  HttpResponse *response;
  
  urlObject = (URL *)type;
  type_local = url;
  url_local = (string *)this;
  this_local = (HttpClient *)__return_storage_ptr__;
  pUVar2 = (URL *)operator_new(0x140);
  local_5d = 1;
  std::__cxx11::string::string(local_50,(string *)url);
  URL::URL(pUVar2,(string *)local_50);
  local_5d = 0;
  std::__cxx11::string::~string(local_50);
  local_30 = pUVar2;
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  std::operator+(local_180,(char *)type);
  URL::GetRelativePath_abi_cxx11_((URL *)(local_1c0 + 0x20));
  std::operator+(local_160,local_180);
  std::operator+(local_140,(char *)local_160);
  std::operator+(local_120,(char *)local_140);
  URL::GetHostName_abi_cxx11_((URL *)local_1c0);
  std::operator+(local_100,local_120);
  std::operator+(local_e0,(char *)local_100);
  std::operator+(local_c0,(char *)local_e0);
  std::__cxx11::string::operator=(local_80,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)(local_1c0 + 0x20));
  std::__cxx11::string::~string((string *)local_180);
  URL::GetHostName_abi_cxx11_((URL *)(local_240 + 0x40));
  std::operator+((char *)local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Making call with hostname: ");
  Log::Add(&this->_log,local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)(local_240 + 0x40));
  URL::GetPortNumber_abi_cxx11_((URL *)local_240);
  std::operator+(local_240 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Port number: ");
  Log::Add(&this->_log,(string *)(local_240 + 0x20));
  std::__cxx11::string::~string((string *)(local_240 + 0x20));
  std::__cxx11::string::~string((string *)local_240);
  std::operator+((char *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Message: \n")
  ;
  Log::Add(&this->_log,local_260);
  std::__cxx11::string::~string((string *)local_260);
  bVar1 = URL::IsSSL(local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"Use https for the call",&local_281);
    Log::Add(&this->_log,(string *)local_280);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    URL::GetHostName_abi_cxx11_((URL *)(local_2e8 + 0x20));
    URL::GetPortNumber_abi_cxx11_((URL *)local_2e8);
    std::__cxx11::string::string(local_308,local_80);
    TCPClient::SendOverSSL(local_2a8,&local_5e,(string *)(local_2e8 + 0x20),(string *)local_2e8);
    std::__cxx11::string::operator=(local_a0,(string *)local_2a8);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)local_2e8);
    std::__cxx11::string::~string((string *)(local_2e8 + 0x20));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"Use http for the call",&local_329);
    Log::Add(&this->_log,(string *)local_328);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    URL::GetHostName_abi_cxx11_((URL *)(local_390 + 0x20));
    URL::GetPortNumber_abi_cxx11_((URL *)local_390);
    std::__cxx11::string::string(local_3b0,local_80);
    TCPClient::Send(local_350,&local_5e,(string *)(local_390 + 0x20),(string *)local_390);
    std::__cxx11::string::operator=(local_a0,(string *)local_350);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)(local_390 + 0x20));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"Request was made, parsing result",&local_3d1);
  Log::Add(&this->_log,(string *)local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_3d2 = 0;
  std::__cxx11::string::string(local_3f8,local_a0);
  pUVar2 = local_30;
  Log::Log(&local_420,&this->_log);
  HttpResponse::HttpResponse(__return_storage_ptr__,(string *)local_3f8,pUVar2,&local_420);
  Log::~Log(&local_420);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"Response was parsed sucessfully",&local_441);
  Log::Add(&this->_log,(string *)local_440);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  local_3d2 = 1;
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  return __return_storage_ptr__;
}

Assistant:

HttpResponse HttpClient::RunRequest(string url, string type) {
  URL* urlObject = new URL(url);
  TCPClient client;
  string message, result;
  message = type + " " + urlObject->GetRelativePath() + " HTTP/1.1\r\n" \
            + "Host: " + urlObject->GetHostName() + "\r\n" \
            + "\r\n";

  _log.Add("Making call with hostname: " + urlObject->GetHostName());
  _log.Add("Port number: " + urlObject->GetPortNumber());
  _log.Add("Message: \n" + message);

  if (urlObject->IsSSL()) {
    _log.Add("Use https for the call");
    result = client.SendOverSSL(urlObject->GetHostName(),
                                urlObject->GetPortNumber(), message);
  } else {
    _log.Add("Use http for the call");
    result = client.Send(urlObject->GetHostName(),
                         urlObject->GetPortNumber(), message);
  }
  _log.Add("Request was made, parsing result");
  HttpResponse response(result, urlObject, _log);
  _log.Add("Response was parsed sucessfully");
  return response;
}